

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_section.cpp
# Opt level: O3

bool pstore::repo::operator==(section_content *lhs,section_content *rhs)

{
  size_t sVar1;
  internal_fixup *__first1;
  internal_fixup *__last1;
  internal_fixup *__first2;
  pointer peVar2;
  bool bVar3;
  size_t sVar4;
  pointer rhs_00;
  pointer this;
  
  if (lhs->kind != rhs->kind) {
    return false;
  }
  if ((lhs->align == rhs->align) && (sVar1 = (lhs->data).elements_, sVar1 == (rhs->data).elements_))
  {
    if (sVar1 != 0) {
      sVar4 = 0;
      do {
        if ((lhs->data).buffer_[sVar4] != (rhs->data).buffer_[sVar4]) {
          return false;
        }
        sVar4 = sVar4 + 1;
      } while (sVar1 != sVar4);
    }
    __first1 = (lhs->ifixups).
               super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
               ._M_impl.super__Vector_impl_data._M_start;
    __last1 = (lhs->ifixups).
              super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    __first2 = (rhs->ifixups).
               super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
               ._M_impl.super__Vector_impl_data._M_start;
    if (((long)__last1 - (long)__first1 ==
         (long)(rhs->ifixups).
               super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
               ._M_impl.super__Vector_impl_data._M_finish - (long)__first2) &&
       (bVar3 = std::__equal<false>::
                equal<pstore::repo::internal_fixup_const*,pstore::repo::internal_fixup_const*>
                          (__first1,__last1,__first2), bVar3)) {
      this = (lhs->xfixups).
             super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
             ._M_impl.super__Vector_impl_data._M_start;
      peVar2 = (lhs->xfixups).
               super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      rhs_00 = (rhs->xfixups).
               super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((long)peVar2 - (long)this ==
          (long)(rhs->xfixups).
                super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)rhs_00) {
        if (this == peVar2) {
          return true;
        }
        do {
          bVar3 = external_fixup::operator==(this,rhs_00);
          if (!bVar3) {
            return bVar3;
          }
          this = this + 1;
          rhs_00 = rhs_00 + 1;
        } while (this != peVar2);
        return bVar3;
      }
    }
  }
  return false;
}

Assistant:

bool operator== (section_content const & lhs, section_content const & rhs) {
            return lhs.kind == rhs.kind && lhs.align == rhs.align && lhs.data == rhs.data &&
                   lhs.ifixups == rhs.ifixups && lhs.xfixups == rhs.xfixups;
        }